

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

FIOBJ http_mimetype_find(char *file_ext,size_t file_ext_len)

{
  int *piVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  FIOBJ FVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  FVar5 = 0;
  uVar2 = fio_siphash13(file_ext,file_ext_len,0,0);
  if (fio_http_mime_types.map != (fio_mime_set__map_s_ *)0x0) {
    uVar9 = -(ulong)(uVar2 == 0) | uVar2;
    if ((fio_http_mime_types.has_collisions != '\0') &&
       (fio_http_mime_types.pos != fio_http_mime_types.count)) {
      fio_mime_set_rehash((fio_mime_set_s *)file_ext);
    }
    uVar6 = 0;
    if (fio_http_mime_types.used_bits != '\0') {
      uVar6 = uVar9;
    }
    uVar3 = ~(-1L << (fio_http_mime_types.used_bits & 0x3f));
    uVar6 = uVar6 ^ (uVar9 >> (fio_http_mime_types.used_bits & 0x3f) |
                    uVar9 << 0x40 - (fio_http_mime_types.used_bits & 0x3f));
    uVar4 = uVar6 & uVar3;
    if (fio_http_mime_types.map[uVar4].hash != uVar9 && fio_http_mime_types.map[uVar4].hash != 0) {
      uVar7 = 0x420;
      if (fio_http_mime_types.capa < 0x181) {
        uVar7 = (fio_http_mime_types.capa >> 2) * 0xb;
      }
      FVar5 = 0;
      uVar8 = 0;
      do {
        if (uVar7 <= uVar8) goto LAB_00149768;
        uVar4 = uVar6 + 0xb + uVar8 & uVar3;
      } while ((fio_http_mime_types.map[uVar4].hash != 0) &&
              (uVar8 = uVar8 + 0xb, fio_http_mime_types.map[uVar4].hash != uVar9));
    }
    if (fio_http_mime_types.map[uVar4].pos == (fio_mime_set__ordered_s_ *)0x0) {
      FVar5 = 0;
    }
    else {
      FVar5 = (fio_http_mime_types.map[uVar4].pos)->obj;
    }
  }
LAB_00149768:
  if ((((~(uint)FVar5 & 6) != 0) && (FVar5 != 0)) && ((FVar5 & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((FVar5 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return FVar5;
}

Assistant:

FIOBJ http_mimetype_find(char *file_ext, size_t file_ext_len) {
  uintptr_t hash = FIO_HASH_FN(file_ext, file_ext_len, 0, 0);
  return fiobj_dup(
      fio_mime_set_find(&fio_http_mime_types, hash, FIOBJ_INVALID));
}